

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O1

scope_stack_ptr scope_stack_push(scope sp,size_t bytes)

{
  int iVar1;
  size_t sVar2;
  size_t *psVar3;
  long *plVar4;
  scope_stack_ptr sVar5;
  char *message;
  
  if ((sp == (scope)0x0) || (bytes == 0 || sp->call_stack == (vector)0x0)) {
    log_write_impl_va("metacall",0x22a,"scope_stack_push",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                      ,LOG_LEVEL_ERROR,"Scope stack push invalid parameters");
    sVar5 = 1;
  }
  else {
    sVar2 = vector_size(sp->call_stack);
    iVar1 = vector_resize(sp->call_stack,bytes + sVar2 + 8);
    if (iVar1 == 0) {
      psVar3 = scope_stack_return(sp);
      if (psVar3 != (size_t *)0x0) {
        plVar4 = (long *)vector_at(sp->call_stack,sVar2);
        if ((plVar4 != (long *)0x0) && (*plVar4 != 0)) {
          *psVar3 = sVar2;
          return sVar2;
        }
        log_write_impl_va("metacall",0x21d,"scope_stack_push",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                          ,LOG_LEVEL_ERROR,"Scope stack push bad stack pointer reference");
      }
      log_write_impl_va("metacall",0x220,"scope_stack_push",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                        ,LOG_LEVEL_ERROR,"Scope stack push bad stack return reference");
      iVar1 = vector_resize(sp->call_stack,sVar2);
      if (iVar1 == 0) {
        return 0;
      }
      message = "Scope stack push bad call stack size decrease";
      sVar2 = 0x224;
    }
    else {
      message = "Scope stack push bad call stack size increase";
      sVar2 = 0x20b;
    }
    sVar5 = 0;
    log_write_impl_va("metacall",sVar2,"scope_stack_push",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                      ,LOG_LEVEL_ERROR,message);
  }
  return sVar5;
}

Assistant:

scope_stack_ptr scope_stack_push(scope sp, size_t bytes)
{
	if (sp != NULL && sp->call_stack != NULL && bytes > 0)
	{
		scope_stack_ptr *return_ptr = NULL;

		scope_stack_ptr prev_size = vector_size(sp->call_stack);

		scope_stack_ptr next_size = prev_size + bytes + sizeof(size_t);

		if (vector_resize(sp->call_stack, next_size) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Scope stack push bad call stack size increase");

			return 0;
		}

		return_ptr = scope_stack_return(sp);

		if (return_ptr != NULL)
		{
			void **prev_ptr = vector_at(sp->call_stack, prev_size);

			if (prev_ptr != NULL && *prev_ptr != NULL)
			{
				*return_ptr = prev_size;

				return prev_size;
			}

			log_write("metacall", LOG_LEVEL_ERROR, "Scope stack push bad stack pointer reference");
		}

		log_write("metacall", LOG_LEVEL_ERROR, "Scope stack push bad stack return reference");

		if (vector_resize(sp->call_stack, prev_size) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Scope stack push bad call stack size decrease");
		}

		return 0;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Scope stack push invalid parameters");

	return 1;
}